

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpAtom.cpp
# Opt level: O0

void __thiscall glslang::TStringAtomMap::TStringAtomMap(TStringAtomMap *this)

{
  ulong local_28;
  size_t ii;
  char *pcStack_18;
  char t [2];
  char *s;
  TStringAtomMap *this_local;
  
  TUnorderedMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::TUnorderedMap(&this->atomMap);
  TVector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_*>
  ::TVector(&this->stringMap);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&this->badToken);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::assign
            (&this->badToken,"<bad token>");
  ii._7_1_ = 0;
  for (pcStack_18 = "~!%^&*()-+=|,.<>/?;:[]{}#\\"; *pcStack_18 != '\0'; pcStack_18 = pcStack_18 + 1)
  {
    ii._6_1_ = *pcStack_18;
    addAtomFixed(this,(char *)((long)&ii + 6),(int)*pcStack_18);
  }
  for (local_28 = 0; local_28 < 0x2a; local_28 = local_28 + 1) {
    addAtomFixed(this,*(char **)(::(anonymous_namespace)::tokens + local_28 * 0x10 + 8),
                 *(int *)(::(anonymous_namespace)::tokens + local_28 * 0x10));
  }
  this->nextAtom = 0xb7;
  return;
}

Assistant:

TStringAtomMap::TStringAtomMap()
{
    badToken.assign("<bad token>");

    // Add single character tokens to the atom table:
    const char* s = "~!%^&*()-+=|,.<>/?;:[]{}#\\";
    char t[2];

    t[1] = '\0';
    while (*s) {
        t[0] = *s;
        addAtomFixed(t, s[0]);
        s++;
    }

    // Add multiple character scanner tokens :
    for (size_t ii = 0; ii < sizeof(tokens)/sizeof(tokens[0]); ii++)
        addAtomFixed(tokens[ii].str, tokens[ii].val);

    nextAtom = PpAtomLast;
}